

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ReusesFeaturesFromSibling_Test::TestBody
          (FeaturesTest_ReusesFeaturesFromSibling_Test *this)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  AssertHelper local_a0;
  Message local_98;
  FeatureSet *local_90;
  FeatureSet *local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  FeatureSet *local_50;
  FeatureSet *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Descriptor *message;
  FileDescriptor *local_18;
  FileDescriptor *file;
  FeaturesTest_ReusesFeaturesFromSibling_Test *this_local;
  
  file = (FileDescriptor *)this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&message,
             "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    options { features { field_presence: IMPLICIT } }\n    message_type {\n      name: \"Foo\"\n      options { deprecated: true }\n      field {\n        name: \"bar1\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_INT64\n        options {\n          deprecated: true\n          features { field_presence: EXPLICIT }\n        }\n      }\n      field {\n        name: \"baz\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { features { field_presence: EXPLICIT } }\n      }\n    }\n  "
            );
  local_18 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,_message);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )FileDescriptor::message_type(local_18,0);
  local_48 = GetFeatures<google::protobuf::FileDescriptor>(local_18);
  pFVar2 = Descriptor::field((Descriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,0);
  local_50 = GetFeatures<google::protobuf::FieldDescriptor>(pFVar2);
  testing::internal::
  CmpHelperNE<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet_const*>
            ((internal *)local_40,"&GetFeatures(file)","&GetFeatures(message->field(0))",&local_48,
             &local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x22e1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  pFVar2 = Descriptor::field((Descriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,0);
  local_88 = GetFeatures<google::protobuf::FieldDescriptor>(pFVar2);
  pFVar2 = Descriptor::field((Descriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,1);
  local_90 = GetFeatures<google::protobuf::FieldDescriptor>(pFVar2);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FeatureSet_*,_const_google::protobuf::FeatureSet_*,_nullptr>
            ((EqHelper *)local_80,"&GetFeatures(message->field(0))",
             "&GetFeatures(message->field(1))",&local_88,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x22e2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST_F(FeaturesTest, ReusesFeaturesFromSibling) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    options { features { field_presence: IMPLICIT } }
    message_type {
      name: "Foo"
      options { deprecated: true }
      field {
        name: "bar1"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_INT64
        options {
          deprecated: true
          features { field_presence: EXPLICIT }
        }
      }
      field {
        name: "baz"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { features { field_presence: EXPLICIT } }
      }
    }
  )pb");
  const Descriptor* message = file->message_type(0);
  EXPECT_NE(&GetFeatures(file), &GetFeatures(message->field(0)));
  EXPECT_EQ(&GetFeatures(message->field(0)), &GetFeatures(message->field(1)));
}